

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int Res(N_Vector ycor,N_Vector f,void *mem)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 *in_RDX;
  long *in_RSI;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  IntegratorMem Imem;
  int local_4;
  
  if (in_RDX == (undefined8 *)0x0) {
    printf("ERROR: Integrator memory is NULL");
    local_4 = -1;
  }
  else {
    N_VLinearSum(*in_RDX,in_RDX[2],in_RDX[1]);
    dVar1 = **(double **)(*(long *)in_RDX[1] + 0x10);
    dVar2 = *(double *)(*(long *)(*(long *)in_RDX[1] + 0x10) + 8);
    dVar3 = *(double *)(*(long *)(*(long *)in_RDX[1] + 0x10) + 0x10);
    **(double **)(*in_RSI + 0x10) = (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) - 1.0;
    *(double *)(*(long *)(*in_RSI + 0x10) + 8) = dVar3 * -4.0 + dVar1 * 2.0 * dVar1 + dVar2 * dVar2;
    *(double *)(*(long *)(*in_RSI + 0x10) + 0x10) =
         dVar3 * dVar3 + dVar1 * dVar1 * 3.0 + -(dVar2 * 4.0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Res(N_Vector ycor, N_Vector f, void* mem)
{
  IntegratorMem Imem;
  sunrealtype y1, y2, y3;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  /* update state based on current correction */
  N_VLinearSum(ONE, Imem->y0, ONE, Imem->ycor, Imem->ycur);

  /* get vector components */
  y1 = NV_Ith_S(Imem->ycur, 0);
  y2 = NV_Ith_S(Imem->ycur, 1);
  y3 = NV_Ith_S(Imem->ycur, 2);

  /* compute the residual function */
  NV_Ith_S(f, 0) = y1 * y1 + y2 * y2 + y3 * y3 - ONE;
  NV_Ith_S(f, 1) = TWO * y1 * y1 + y2 * y2 - FOUR * y3;
  NV_Ith_S(f, 2) = THREE * (y1 * y1) - FOUR * y2 + y3 * y3;

  /* return success */
  return (0);
}